

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::SSARewriter::GetValueAtBlock(SSARewriter *this,uint32_t var_id,BasicBlock *bb)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  ulong uVar3;
  ulong uVar4;
  _Hash_node_base *p_Var5;
  __node_base_ptr p_Var6;
  _Hash_node_base *p_Var7;
  __node_base_ptr p_Var8;
  
  if (bb == (BasicBlock *)0x0) {
    __assert_fail("bb != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/ssa_rewrite_pass.cpp"
                  ,0xf4,
                  "uint32_t spvtools::opt::SSARewriter::GetValueAtBlock(uint32_t, BasicBlock *)");
  }
  uVar4 = (this->defs_at_block_)._M_h._M_bucket_count;
  uVar3 = (ulong)bb % uVar4;
  p_Var6 = (this->defs_at_block_)._M_h._M_buckets[uVar3];
  p_Var8 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var6->_M_nxt, p_Var8 = p_Var6, (BasicBlock *)p_Var6->_M_nxt[1]._M_nxt != bb)) {
    while (p_Var6 = p_Var2, p_Var2 = p_Var6->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var8 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar4 != uVar3) ||
         (p_Var8 = p_Var6, (BasicBlock *)p_Var2[1]._M_nxt == bb)) goto LAB_0019ce8e;
    }
    p_Var8 = (__node_base_ptr)0x0;
  }
LAB_0019ce8e:
  if (p_Var8 == (__node_base_ptr)0x0) {
    p_Var2 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var2 = p_Var8->_M_nxt;
  }
  if (p_Var2 != (_Hash_node_base *)0x0) {
    uVar4 = (ulong)var_id % (ulong)p_Var2[3]._M_nxt;
    p_Var5 = p_Var2[2]._M_nxt[uVar4]._M_nxt;
    p_Var7 = (_Hash_node_base *)0x0;
    if ((p_Var5 != (_Hash_node_base *)0x0) &&
       (p_Var1 = p_Var5->_M_nxt, p_Var7 = p_Var5, *(uint32_t *)&p_Var5->_M_nxt[1]._M_nxt != var_id))
    {
      while (p_Var5 = p_Var1, p_Var1 = p_Var5->_M_nxt, p_Var1 != (_Hash_node_base *)0x0) {
        p_Var7 = (_Hash_node_base *)0x0;
        if (((ulong)*(uint *)&p_Var1[1]._M_nxt % (ulong)p_Var2[3]._M_nxt != uVar4) ||
           (p_Var7 = p_Var5, *(uint *)&p_Var1[1]._M_nxt == var_id)) goto LAB_0019cef7;
      }
      p_Var7 = (_Hash_node_base *)0x0;
    }
LAB_0019cef7:
    if (p_Var7 == (_Hash_node_base *)0x0) {
      p_Var2 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var2 = p_Var7->_M_nxt;
    }
    if (p_Var2 != (_Hash_node_base *)0x0) {
      return *(uint32_t *)((long)&p_Var2[1]._M_nxt + 4);
    }
  }
  return 0;
}

Assistant:

uint32_t SSARewriter::GetValueAtBlock(uint32_t var_id, BasicBlock* bb) {
  assert(bb != nullptr);
  const auto& bb_it = defs_at_block_.find(bb);
  if (bb_it != defs_at_block_.end()) {
    const auto& current_defs = bb_it->second;
    const auto& var_it = current_defs.find(var_id);
    if (var_it != current_defs.end()) {
      return var_it->second;
    }
  }
  return 0;
}